

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

string * deqp::gles31::Functional::anon_unknown_1::generateTessEvaluationShader
                   (string *__return_storage_ptr__,ShaderType shaderType,
                   string *shaderUniformDeclarations,string *shaderBody)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream tessEvaluationShaderSource;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  if (shaderType < SHADERTYPE_TESS_EVALUATION) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = 
    "#version 310 es\n#extension GL_EXT_tessellation_shader : require\nlayout (triangles) in;\n\nvoid main (void)\n{\n\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n}\n"
    ;
    pcVar2 = "";
  }
  else {
    if (shaderType - SHADERTYPE_TESS_EVALUATION < 2) {
      std::__cxx11::ostringstream::ostringstream(aoStack_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_198,"#version 310 es\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_198,"#extension GL_EXT_tessellation_shader : require\n",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_198,"layout (triangles) in;\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_198,"uniform highp int u_arrayNdx;\n\n",0x1f);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)aoStack_198,(shaderUniformDeclarations->_M_dataplus)._M_p,
                          shaderUniformDeclarations->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"out mediump vec4 v_color;\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\thighp vec4 color;\n\n",0x14);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(shaderBody->_M_dataplus)._M_p,shaderBody->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tv_color = color;\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n"
                 ,0x89);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(aoStack_198);
      std::ios_base::~ios_base(local_128);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string generateTessEvaluationShader (ShaderType shaderType, const std::string& shaderUniformDeclarations, const std::string& shaderBody)
{
	static const char* const s_simpleTessEvaluationShaderSource =	"#version 310 es\n"
																	"#extension GL_EXT_tessellation_shader : require\n"
																	"layout (triangles) in;\n"
																	"\n"
																	"void main (void)\n"
																	"{\n"
																	"	gl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n"
																	"}\n";

	switch (shaderType)
	{
		case SHADERTYPE_VERTEX:
		case SHADERTYPE_FRAGMENT:
		case SHADERTYPE_TESS_CONTROL:
			return s_simpleTessEvaluationShaderSource;

		case SHADERTYPE_TESS_EVALUATION:
		case SHADERTYPE_ALL:
		{
			std::ostringstream tessEvaluationShaderSource;
			tessEvaluationShaderSource	<< "#version 310 es\n"
										<< "#extension GL_EXT_tessellation_shader : require\n"
										<< "layout (triangles) in;\n"
										<< "\n"
										<< "uniform highp int u_arrayNdx;\n\n"
										<< shaderUniformDeclarations << "\n"
										<< "out mediump vec4 v_color;\n"
										<< "void main (void)\n"
										<< "{\n"
										<< "	highp vec4 color;\n\n"
										<<	shaderBody << "\n"
										<< "	v_color = color;\n"
										<< "	gl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n"
										<< "}\n";

			return tessEvaluationShaderSource.str();
		}

		default:
			DE_ASSERT(false);
			return "";
	}
}